

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend_sdl.cpp
# Opt level: O3

bool __thiscall
CGraphicsBackend_SDL_OpenGL::GetDesktopResolution
          (CGraphicsBackend_SDL_OpenGL *this,int Index,int *pDesktopWidth,int *pDesktopHeight)

{
  int iVar1;
  long in_FS_OFFSET;
  SDL_DisplayMode DisplayMode;
  undefined1 local_30 [4];
  int local_2c;
  int local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = SDL_GetDesktopDisplayMode(Index,local_30);
  if (iVar1 == 0) {
    *pDesktopWidth = local_2c;
    *pDesktopHeight = local_28;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar1 == 0;
  }
  __stack_chk_fail();
}

Assistant:

bool CGraphicsBackend_SDL_OpenGL::GetDesktopResolution(int Index, int *pDesktopWidth, int* pDesktopHeight)
{
	SDL_DisplayMode DisplayMode;
	if(SDL_GetDesktopDisplayMode(Index, &DisplayMode))
		return false;

	*pDesktopWidth = DisplayMode.w;
	*pDesktopHeight = DisplayMode.h;
	return true;
}